

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> *
convolute(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,Settings *s,
         Data *d,vector<unsigned_int,_std::allocator<unsigned_int>_> *kernel)

{
  double *pdVar1;
  double dVar2;
  pointer __s;
  pointer puVar3;
  pointer pdVar4;
  pointer pdVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  long lVar10;
  size_type __n;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  double dVar21;
  string pstr;
  uint local_154;
  long *local_150;
  long local_148;
  long local_140 [2];
  double local_130;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_128;
  double local_120;
  double local_118;
  double dStack_110;
  string local_100;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  string local_a8;
  string local_88;
  string local_68;
  double local_48;
  double dStack_40;
  
  __n = (long)s->ny * (long)s->nx;
  s->nxy = (int)__n;
  local_128 = kernel;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,__n,(allocator_type *)&local_150);
  __s = (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__s != puVar3) {
    memset(__s,0,((long)puVar3 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
  }
  local_150 = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"=","");
  if (s->sampling == pointwise) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Convoluting pointwise...",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,local_150,local_148 + (long)local_150);
    printBar(0x46,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    uVar13 = (ulong)(uint)d->ntrkptsum;
    if (0 < d->ntrkptsum) {
      iVar12 = 0;
      lVar10 = 0;
      do {
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_100,local_150,local_148 + (long)local_150);
        printProgress(iVar12 / (int)uVar13,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        addKernel(s,(d->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar10],
                  (d->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar10],__return_storage_ptr__,local_128,1.0);
        lVar10 = lVar10 + 1;
        uVar13 = (ulong)d->ntrkptsum;
        iVar12 = iVar12 + 0x46;
      } while (lVar10 < (long)uVar13);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Convoluting linearly...",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,local_150,local_148 + (long)local_150);
    printBar(0x46,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    iVar12 = d->ntrkptsum;
    if (0 < iVar12) {
      local_154 = 0;
      local_120 = 1.0;
      dVar19 = 0.0;
      dVar20 = 0.0;
      uVar13 = 0;
      uVar14 = 0;
      uVar15 = 0;
      do {
        local_48 = (double)CONCAT44(uVar15,uVar14);
        dStack_40 = 0.0;
        local_118 = dVar19;
        dStack_110 = dVar20;
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,local_150,local_148 + (long)local_150);
        uVar11 = (uint)uVar13;
        printProgress((int)(uVar11 * 0x46) / iVar12,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        dVar19 = local_118;
        dVar20 = dStack_110;
        if (uVar11 == (d->iEndSeg).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[local_154]) {
          local_154 = local_154 + 1;
          uVar13 = (ulong)(uVar11 + 1);
          iVar12 = d->ntrkptsum;
          dVar16 = 0.0;
        }
        else {
          if (s->mapType != heat) {
            pdVar4 = (d->scas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_130 = pdVar4[(int)uVar11];
            local_e0 = pdVar4[(long)(int)uVar11 + 1];
          }
          pdVar4 = (d->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar5 = (d->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_b0 = pdVar5[(int)uVar11];
          local_c0 = pdVar4[(int)uVar11];
          local_b8 = pdVar5[(long)(int)uVar11 + 1] - local_b0;
          local_c8 = pdVar4[(long)(int)uVar11 + 1] - local_c0;
          dVar21 = SQRT(local_c8 * local_c8 + local_b8 * local_b8) / s->degPerPix;
          auVar18._8_8_ = dStack_40;
          auVar18._0_8_ = local_48;
          if (local_48 < 1.0) {
            local_d8 = local_e0 - local_130;
            uVar14 = SUB84(dStack_40,0);
            uVar15 = (undefined4)((ulong)dStack_40 >> 0x20);
            dVar19 = local_48;
            local_d0 = dVar21;
            do {
              dStack_110 = (double)CONCAT44(uVar15,uVar14);
              if (s->mapType != heat) {
                local_120 = (((dVar19 * local_d8 + local_130) - s->mins) * 1000000000.0) /
                            (s->maxs - s->mins);
              }
              local_118 = dVar19;
              addKernel(s,dVar19 * local_c8 + local_c0,dVar19 * local_b8 + local_b0,
                        __return_storage_ptr__,local_128,local_120);
              dVar21 = local_d0;
              if ((local_d0 == 0.0) && (!NAN(local_d0))) {
                uVar13 = (ulong)(uVar11 + 1);
                auVar18._8_8_ = dStack_40;
                auVar18._0_8_ = local_48;
                dVar19 = local_48;
                dVar20 = dStack_40;
                goto LAB_0010eaba;
              }
              uVar14 = 0;
              uVar15 = 0;
              dVar19 = ((double)s->r * s->step) / local_d0 + local_118;
            } while (dVar19 < 1.0);
            auVar18._8_8_ = 0;
            auVar18._0_8_ = dVar19;
            dVar19 = local_118;
            dVar20 = dStack_110;
          }
LAB_0010eaba:
          dVar16 = auVar18._0_8_;
          iVar12 = d->ntrkptsum;
          if (((dVar21 != 0.0) || (NAN(dVar21))) && (1.0 <= dVar16)) {
            pdVar4 = (d->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar6 = (double)s->r * s->step;
            uVar13 = (ulong)(int)uVar13;
            do {
              dVar16 = auVar18._0_8_;
              if (((d->iEndSeg).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[local_154] <= (uint)uVar13) ||
                 ((long)iVar12 <= (long)uVar13)) break;
              dVar16 = pdVar4[uVar13 + 1];
              dVar2 = pdVar4[uVar13 + 2];
              pdVar1 = (d->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar13 + 1;
              dVar8 = *pdVar1;
              dVar9 = pdVar1[1];
              if (((dVar8 != dVar9) || ((NAN(dVar8) || NAN(dVar9) || (dVar16 != dVar2)))) ||
                 (NAN(dVar16) || NAN(dVar2))) {
                dVar16 = SQRT((dVar2 - dVar16) * (dVar2 - dVar16) +
                              (dVar9 - dVar8) * (dVar9 - dVar8)) / s->degPerPix;
                auVar17._0_8_ = dVar6 - dVar21 * (1.0 - dVar19);
                auVar17._8_8_ = dVar6;
                auVar7._8_8_ = dVar16;
                auVar7._0_8_ = dVar16;
                auVar18 = divpd(auVar17,auVar7);
                dVar20 = auVar18._8_8_;
                dVar19 = auVar18._0_8_ - dVar20;
                dVar21 = dVar16;
              }
              uVar13 = uVar13 + 1;
              dVar16 = auVar18._0_8_;
            } while (1.0 <= dVar16);
          }
        }
        uVar14 = 0;
        uVar15 = 0;
        if (0.0 <= dVar16) {
          uVar14 = SUB84(dVar16,0);
          uVar15 = (undefined4)((ulong)dVar16 >> 0x20);
        }
      } while ((int)uVar13 < iVar12);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  if (local_150 != local_140) {
    operator_delete(local_150,local_140[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> convolute(Settings& s, Data& d,
		std::vector<unsigned int>& kernel)
{
	s.nxy = s.nx * s.ny;
	std::vector<unsigned int> img(s.nxy);

	// Initialize
	std::fill(img.begin(), img.end(), 0);

	// Number of characters in progress bar
	int np = 70;
	const std::string pstr = "=";

	// Kernel scalar for map types other than heat
	double scalar = 1.0;
	double scaleMax = 1.e9;

	if (s.sampling == pointwise)
	{
		std::cout << "Convoluting pointwise..." << std::endl;
		printBar(np, pstr);
		for (int i = 0; i < d.ntrkptsum; i++)
		{
			printProgress(np * i / d.ntrkptsum, pstr);
			addKernel(s, d.lats[i], d.lons[i], img, kernel, scalar);
		}
	}
	else
	{
		std::cout << "Convoluting linearly..." << std::endl;
		printBar(np, pstr);
		unsigned int iseg = 0;
		double dd = 0.0;
		double dd0 = 0.0;

		int i = 0;
		while (i < d.ntrkptsum)
		{
			double dpix;
			printProgress(np * i / d.ntrkptsum, pstr);
			if (i == d.iEndSeg[iseg])
			{
				// Final point
				iseg++;
				i++;
				dd = 0.0;
			}
			else
			{
				//std::cout << "sampling dd = " << dd << std::endl;

				// Linear subsampling

				double x0 = d.lons[i];
				double y0 = d.lats[i];
				double x1 = d.lons[i + 1];
				double y1 = d.lats[i + 1];

				double s0, s1;
				if (s.mapType != heat)
				{
					s0 = d.scas[i];
					s1 = d.scas[i + 1];
				}

				// Distance between trackpoint i and i+1 in units of
				// pixels.  Already calculated?
				dpix = sqrt(pow(x1 - x0, 2) + pow(y1 - y0, 2)) / s.degPerPix;

				while (dd < 1.0)
				{
					//std::cout << "dd = " << dd << std::endl;

					double lat = y0 + dd * (y1 - y0);
					double lon = x0 + dd * (x1 - x0);

					if (s.mapType != heat)
					{
						double sca = s0 + dd * (s1 - s0);
						scalar = scaleMax * (sca - s.mins) / (s.maxs - s.mins);
						//std::cout << "scalar = " << scalar << "\n";
					}

					addKernel(s, lat, lon, img, kernel, scalar);

					dd0 = dd;
					if (dpix == 0.0)
					{
						i++;
						break;
					}
					else
					{
						// Move a step of a fraction of the kernel radius
						dd += s.step * s.r / dpix;
					}

				}
			}
			//std::cout << "d.iEndSeg[iseg] = " << d.iEndSeg[iseg] << "\n";

			// Offset next kernel one step size away from last one
			double dpix0 = dpix;
			if (dpix0 != 0.0)
			{
				while (dd >= 1.0 && i < d.iEndSeg[iseg] && i < d.ntrkptsum)
				{
					i++;
					//std::cout << "i = " << i << std::endl;

					double x0 = d.lons[i];
					double y0 = d.lats[i];
					double x1 = d.lons[i + 1];
					double y1 = d.lats[i + 1];

					if (x0 != x1 || y0 != y1)
					{
						dpix0 = dpix;
						dpix = sqrt(pow(x1 - x0, 2) + pow(y1 - y0, 2)) / s.degPerPix;

						// Residual distance leftover from the last
						// line, as a fraction of last line's length
						double ddres = 1.0 - dd0;

						// Residual in pixels
						double pixres = ddres * dpix0;

						// Offset from new starting point in pixels
						double pixstart = s.step * s.r - pixres;

						// Dimensionless offset (and hypothetical
						// previous point in case of overflow)
						dd = pixstart / dpix;
						dd0 = dd - s.step * s.r / dpix;

						//std::cout << "dd = " << dd << std::endl;
					}
				}
			}

			// Just in case
			dd = std::max(dd, 0.0);

		}
	}
	std::cout << "|" << std::endl;

	//std::cout << img << std::endl;
	return img;
}